

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O1

int Potassco::xconvert(char *x,unsigned_long_long *out,char **errPos,int param_4)

{
  bool bVar1;
  char *local_10;
  
  local_10 = x;
  bVar1 = parseUnsigned(&local_10,out,0xffffffffffffffff);
  if (errPos != (char **)0x0) {
    *errPos = local_10;
  }
  return (int)bVar1;
}

Assistant:

int xconvert(const char* x, unsigned long long& out, const char** errPos, int) {
	int tok = parseUnsigned(x, out, ULLONG_MAX);
	return parsed(tok, x, errPos);
}